

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# std_names.cpp
# Opt level: O2

prefix_t * so_5::stats::prefixes::mbox_repository(void)

{
  prefix_t *in_RDI;
  
  prefix_t::prefix_t(in_RDI,"mbox_repository");
  return in_RDI;
}

Assistant:

SO_5_FUNC prefix_t
mbox_repository()
	{
		return prefix_t( "mbox_repository" );
	}